

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplesort.hpp
# Opt level: O2

vector<unsigned_long,_std::allocator<unsigned_long>_> * __thiscall
mxx::impl::
split<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,std::less<std::pair<int,int>>>
          (vector<unsigned_long,_std::allocator<unsigned_long>_> *__return_storage_ptr__,impl *this,
          long begin,long *end,long param_5)

{
  ulong uVar1;
  bool bVar2;
  ulong uVar3;
  long lVar4;
  unsigned_long uVar5;
  ulong uVar6;
  pointer puVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  size_type __n;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  pair<__gnu_cxx::__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,___gnu_cxx::__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  pVar17;
  allocator_type local_69;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_68;
  long local_60;
  pair<int,_int> *local_58;
  long *local_50;
  ulong local_48;
  long local_40;
  value_type_conflict1 local_38;
  
  __n = (size_type)*(int *)(param_5 + 0x10);
  local_68 = __return_storage_ptr__;
  local_60 = begin;
  local_50 = end;
  if (end[1] - *end >> 3 != __n - 1) {
    assert_fail("splitters.size() == (size_t)comm.size() - 1",
                "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/include/mxx/samplesort.hpp"
                ,0xc3,"split");
    __n = (size_type)*(int *)(param_5 + 0x10);
  }
  local_38 = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (local_68,__n,&local_38,&local_69);
  local_48 = local_60 - (long)this >> 3;
  uVar3 = local_48 / *(uint *)(param_5 + 0x10);
  uVar9 = local_48 % (ulong)*(uint *)(param_5 + 0x10);
  uVar16 = 0;
  local_40 = param_5;
  do {
    lVar8 = *local_50;
    lVar4 = local_50[1];
    if ((ulong)(lVar4 - lVar8 >> 3) <= uVar16) {
      puVar7 = (local_68->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
               .super__Vector_impl_data._M_start;
      puVar7[(long)*(int *)(local_40 + 0x10) + -1] =
           puVar7[(long)*(int *)(local_40 + 0x10) + -1] + (local_60 - (long)this >> 3);
      uVar16 = 0;
      for (; puVar7 != (local_68->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
                       ._M_impl.super__Vector_impl_data._M_finish; puVar7 = puVar7 + 1) {
        uVar16 = uVar16 + *puVar7;
      }
      if (uVar16 != local_48) {
        assert_fail("std::accumulate(send_counts.begin(), send_counts.end(), static_cast<size_t>(0)) == local_size"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/include/mxx/samplesort.hpp"
                    ,0xec,"split");
      }
      return local_68;
    }
    uVar15 = 1;
    uVar6 = 2;
    local_58 = (pair<int,_int> *)this;
    while( true ) {
      uVar11 = ((int)uVar6 - 1) + uVar16;
      if ((ulong)(lVar4 - lVar8 >> 3) <= uVar11) break;
      bVar2 = std::operator<((pair<int,_int> *)(lVar8 + uVar16 * 8),
                             (pair<int,_int> *)(lVar8 + uVar11 * 8));
      lVar8 = *local_50;
      if (bVar2) break;
      lVar4 = local_50[1];
      uVar6 = (ulong)((int)uVar6 + 1);
      uVar15 = uVar15 + 1;
    }
    pVar17 = std::
             __equal_range<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,std::pair<int,int>,__gnu_cxx::__ops::_Iter_comp_val<std::less<std::pair<int,int>>>,__gnu_cxx::__ops::_Val_comp_iter<std::less<std::pair<int,int>>>>
                       (local_58,local_60,lVar8 + uVar16 * 8);
    this = (impl *)pVar17.second._M_current;
    puVar7 = (local_68->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar5 = ((long)pVar17.first._M_current._M_current - (long)local_58 >> 3) + puVar7[uVar16];
    puVar7[uVar16] = uVar5;
    uVar12 = (long)this - (long)pVar17.first._M_current >> 3;
    uVar6 = (uVar5 + uVar12) / uVar6 + 1;
    uVar10 = (ulong)uVar15;
    while (bVar2 = uVar10 != 0, uVar10 = uVar10 - 1, bVar2) {
      uVar1 = puVar7[uVar16];
      uVar13 = uVar3 + ((uVar16 & 0xffffffff) < uVar9);
      uVar14 = uVar13 - uVar1;
      if (uVar13 < uVar1 || uVar14 == 0) {
        uVar14 = 0;
      }
      else {
        if (uVar14 <= uVar6) {
          uVar14 = uVar6;
        }
        if (uVar12 < uVar14) {
          uVar14 = uVar12;
        }
        uVar12 = uVar12 - uVar14;
      }
      puVar7[uVar16] = uVar14 + uVar1;
      uVar16 = uVar16 + 1;
    }
    puVar7[uVar11] = puVar7[uVar11] + uVar12;
    uVar16 = uVar11;
  } while( true );
}

Assistant:

std::vector<size_t> split(_Iterator begin, _Iterator end, _Compare comp, const std::vector<typename std::iterator_traits<_Iterator>::value_type>& splitters, const mxx::comm& comm) {
    // 5. locally find splitter positions in data
    //    (if an identical splitter appears at least three times (or more),
    //    then split the intermediary buckets evenly) => send_counts
    MXX_ASSERT(splitters.size() == (size_t)comm.size() - 1);
    std::vector<size_t> send_counts(comm.size(), 0);
    _Iterator pos = begin;
    size_t local_size = std::distance(begin, end);
    blk_dist local_part(local_size, comm.size(), comm.rank());
    for (size_t i = 0; i < splitters.size();) {
        // get the number of splitters which are equal starting from `i`
        unsigned int split_by = 1;
        while (i+split_by < splitters.size()
               && !comp(splitters[i], splitters[i+split_by])) {
            ++split_by;
        }

        // get the range of equal elements
        std::pair<_Iterator, _Iterator> eqr = std::equal_range(pos, end, splitters[i], comp);

        // assign smaller elements to processor left of splitter (= `i`)
        send_counts[i] += std::distance(pos, eqr.first);
        pos = eqr.first;

        // split equal elements fairly across processors
        size_t eq_size = std::distance(pos, eqr.second);
        // try to split approx equal:
        size_t eq_size_split = (eq_size + send_counts[i]) / (split_by+1) + 1;
        for (unsigned int j = 0; j < split_by; ++j) {
            size_t out_size = 0;
            if (send_counts[i+j] < local_part.local_size(i+j)) {
                // try to distribute fairly
                out_size = std::min(std::max(local_part.local_size(i+j) - send_counts[i+j], eq_size_split), eq_size);
                eq_size -= out_size;
            }
            send_counts[i+j] += out_size;
        }
        // assign remaining elements to next processor
        send_counts[i+split_by] += eq_size;
        i += split_by;
        pos = eqr.second;
    }
    // send last elements to last processor
    size_t out_size = std::distance(pos, end);
    send_counts[comm.size() - 1] += out_size;
    MXX_ASSERT(std::accumulate(send_counts.begin(), send_counts.end(), static_cast<size_t>(0)) == local_size);
    return send_counts;
}